

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O0

int main(int argc,char **argv)

{
  char local_388 [8];
  string f2;
  string f1;
  string h_fname;
  string c_fname;
  string i_fname;
  string v_fname;
  string out_path;
  string in_path;
  int local_100;
  int col;
  int row;
  int binary;
  int a;
  int y [2];
  int x [2];
  int ssd;
  int iter;
  int nbin;
  int histo;
  int h_type;
  int f_type;
  int pyr;
  int sf;
  int sp;
  int sm;
  int level;
  int n2;
  int n1;
  float density;
  float std;
  float avg_err;
  float div;
  float incr;
  float trsh;
  uchar hd [32];
  qnode_ptr_t fl;
  qnode_ptr_t flq;
  qnode_ptr_t flh;
  qnode_ptr_t im2q;
  qnode_ptr_t im2h;
  qnode_ptr_t im1q;
  qnode_ptr_t im1h;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  im1h = (qnode_ptr_t)argv;
  argv_local._0_4_ = argc;
  valid_option(argc,argv,out_path + 0x48,v_fname + 0x48,&level,&sm,&sp,&nbin,&iter,&sf,&pyr,&f_type,
               &h_type,x,&histo,&div,c_fname + 0x48,i_fname + 0x48,h_fname + 0x48,f1 + 0x48,&ssd,
               &avg_err,x + 1,&col,&local_100,(int *)(in_path + 0x4c));
  printf("STAGE 1: Options Validated\n");
  fflush(_stdout);
  init_list(&im1q,&im2h);
  init_list(&im2q,&flh);
  init_list(&flq,&fl);
  init_kernel_a(&kera);
  init_kernel_b(&kerb);
  filenames(c_fname + 0x48,level,sm,f2 + 0x48,local_388,&std);
  if (col == 0) {
    raster_size(f2 + 0x48,y,&binary,&row);
    raster_size(local_388,y + 1,&a,&row);
    valid_size(y,&binary);
  }
  else {
    y[0]._0_1_ = in_path[0x4c];
    y[0]._1_1_ = in_path[0x4d];
    y[0]._2_1_ = in_path[0x4e];
    y[0]._3_1_ = in_path[0x4f];
    y[1]._0_1_ = in_path[0x4c];
    y[1]._1_1_ = in_path[0x4d];
    y[1]._2_1_ = in_path[0x4e];
    y[1]._3_1_ = in_path[0x4f];
    binary = local_100;
    a = local_100;
    binary_size(in_path._76_4_,local_100,&row);
  }
  printf("STAGE 2: Initializations Completed\n");
  fflush(_stdout);
  create_pyramid(&im1q,&im2h,sp,row,y[0],binary,2);
  create_pyramid(&im2q,&flh,sp,row,y[1],a,2);
  if (col == 0) {
    pgetrast(f2 + 0x48,(uchar *)&incr,*im2h->gauss_ptr,y[0],binary,row);
    pgetrast(local_388,(uchar *)&incr,*flh->gauss_ptr,y[1],a,row);
  }
  else {
    Bpgetrast(f2 + 0x48,*im2h->gauss_ptr,in_path._76_4_,local_100,row);
    Bpgetrast(local_388,*flh->gauss_ptr,in_path._76_4_,local_100,row);
  }
  printf("STAGE 3: Input Data Read\n");
  fflush(_stdout);
  if (h_type == 2) {
    cons_lap(im2h);
    cons_lap(flh);
  }
  else {
    cons_gauss(im2h);
    cons_gauss(flh);
  }
  printf("STAGE 4: Pyramids Created\n");
  fflush(_stdout);
  if (x[0] == 3) {
    init_beaudet3(&Ix,&Ixx,&Ixy);
  }
  else if (x[0] == 5) {
    init_beaudet5(&Ix,&Ixx,&Ixy);
  }
  else if (x[0] == 7) {
    init_beaudet7(&Ix,&Ixx,&Ixy);
  }
  while (sp = sp + -1, im1q != (qnode_ptr_t)0x0 && im2q != (qnode_ptr_t)0x0) {
    hd._24_8_ = create_node(sp,im1q->res,im1q->sizx,im1q->sizy);
    insert_node((qnode_ptr_t)hd._24_8_,&flq,&fl);
    alloc_flow((qnode_ptr_t)hd._24_8_);
    compute_flow(&im1q,&im2h,&im2q,&flh,&flq,&fl,sf,pyr,x[1]);
  }
  printf("STAGE 5: Flow Estimated\n");
  fflush(_stdout);
  if (f_type != 0) {
    filter(fl,fl,histo,SUB84((double)div,0));
    printf("STAGE 6: Filtering Out Completed\n");
    fflush(_stdout);
  }
  if (iter != 0) {
    prod_histo(fl,h_fname + 0x48,f1 + 0x48,ssd,SUB84((double)avg_err,0),nbin,&density,(float *)&n1,
               (float *)&n2,SUB84((double)std,0));
    printf("STAGE 7: Histograms Produced\n");
    fflush(_stdout);
  }
  dump_flow(&flq,&fl,i_fname + 0x48,SUB84((double)std,0));
  printf("STAGE 8: Flow Field Written to File\n");
  fflush(_stdout);
  printf("STAGE 9: End of Program\n\n");
  if (iter != 0) {
    printf("         Average Angular Error: %10.5f\n",(double)density);
    printf("            Standard Deviation: %10.5f\n",(double)(float)n1);
    printf("                       Density: %10.5f\n",(double)(float)n2 * 100.0);
    fflush(_stdout);
  }
  return argv_local._4_4_;
}

Assistant:

int main(argc,argv)
int argc ;
char *argv[] ;

{ qnode_ptr_t create_node(), im1h, im1q, im2h, im2q, flh, flq, fl ;
  unsigned char hd[H] ;
  float trsh, incr, div, avg_err, std, density ;
  int n1, n2, level, sm, sp, sf, pyr, f_type, h_type, histo, nbin, iter, ssd,
  x[N_FRAME], y[N_FRAME], a, binary, row, col ;
  string in_path, out_path, v_fname, i_fname, c_fname, h_fname, f1, f2 ;

  valid_option(argc,argv,in_path,out_path,&n1,&n2,&level,&h_type,&histo,&sm,
               &sp,&sf,&pyr,&ssd,&f_type,&trsh,i_fname,v_fname,c_fname,h_fname,
               &nbin,&incr,&iter,&binary,&row,&col) ;
  printf("STAGE 1: Options Validated\n") ; fflush(stdout) ;
  init_list(&im1h,&im1q) ;
  init_list(&im2h,&im2q) ;
  init_list(&flh,&flq) ;
  init_kernel_a(&kera) ;
  init_kernel_b(&kerb) ;
  filenames(i_fname,n1,n2,f1,f2,&div) ;
  if (!binary) {
    raster_size(f1,&(x[0]),&(y[0]),&a) ;
    raster_size(f2,&(x[1]),&(y[1]),&a) ;
    valid_size(x,y) ;
  }
  else {
    x[0] = col ; x[1] = col ;
    y[0] = row ; y[1] = row ;
    binary_size(col,row,&a) ;
  }
  printf("STAGE 2: Initializations Completed\n") ; fflush(stdout) ;
  create_pyramid(&im1h,&im1q,level,a,x[0],y[0],2) ;
  create_pyramid(&im2h,&im2q,level,a,x[1],y[1],2) ;
  if (!binary) {
    pgetrast(f1,hd,im1q->gauss_ptr,x[0],y[0],a) ;
    pgetrast(f2,hd,im2q->gauss_ptr,x[1],y[1],a) ;
  }
  else {
    Bpgetrast(f1,im1q->gauss_ptr,col,row,a) ;
    Bpgetrast(f2,im2q->gauss_ptr,col,row,a) ;
  }
  printf("STAGE 3: Input Data Read\n") ; fflush(stdout) ;
  if (pyr == LAP) {
    cons_lap(im1q) ;
    cons_lap(im2q) ;
  }
  else {
    cons_gauss(im1q) ;
    cons_gauss(im2q) ;
  }
  printf("STAGE 4: Pyramids Created\n") ; fflush(stdout) ;
  if (ssd == 3) {
    init_beaudet3(&Ix,&Ixx,&Ixy) ;
  }
  else {
    if (ssd == 5) {
      init_beaudet5(&Ix,&Ixx,&Ixy) ;
    }
    else {
      if (ssd == 7) {
        init_beaudet7(&Ix,&Ixx,&Ixy) ;
      }
    }
  }
  level -= 1 ;
  while ((im1h != (qnode_ptr_t)NULL) && (im2h != (qnode_ptr_t)NULL)) {
    fl = create_node(level,im1h->res,im1h->sizx,im1h->sizy) ;
    insert_node(fl,&flh,&flq) ;
    alloc_flow(fl) ;
    compute_flow(&im1h,&im1q,&im2h,&im2q,&flh,&flq,sm,sp,iter) ;
    level-- ;
  }
  printf("STAGE 5: Flow Estimated\n") ; fflush(stdout) ;
  if (sf) {
    filter(flq,flq,f_type,trsh) ;
    printf("STAGE 6: Filtering Out Completed\n") ; fflush(stdout) ;
  }
  if (histo) {
    prod_histo(flq,c_fname,h_fname,nbin,incr,h_type,&avg_err,&std,&density,div) ;
    printf("STAGE 7: Histograms Produced\n") ; fflush(stdout) ;
  }
  dump_flow(&flh,&flq,v_fname,div) ;
  printf("STAGE 8: Flow Field Written to File\n") ; fflush(stdout) ;
  printf("STAGE 9: End of Program\n\n") ;
  if (histo) {
    printf("         Average Angular Error: %10.5f\n", avg_err) ;
    printf("            Standard Deviation: %10.5f\n", std) ;
    printf("                       Density: %10.5f\n", density*100.0) ;
    fflush(stdout) ;
  }
}